

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3WhereMinMaxOptEarlyOut(Vdbe *v,WhereInfo *pWInfo)

{
  long *plVar1;
  long lVar2;
  int *piVar3;
  
  if (((pWInfo->field_0x44 & 4) == 0) || (pWInfo->nOBSat == '\0')) {
    return;
  }
  piVar3 = &pWInfo->a[pWInfo->nLevel].addrNxt;
  lVar2 = (ulong)pWInfo->nLevel + 1;
  do {
    if (lVar2 + -1 == 0 || lVar2 < 1) {
      piVar3 = &pWInfo->iBreak;
      break;
    }
    plVar1 = (long *)(piVar3 + -8);
    piVar3 = piVar3 + -0x1c;
    lVar2 = lVar2 + -1;
  } while ((*(byte *)(*plVar1 + 0x30) & 4) == 0);
  sqlite3VdbeAddOp3(v,9,0,*piVar3,0);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3WhereMinMaxOptEarlyOut(Vdbe *v, WhereInfo *pWInfo){
  WhereLevel *pInner;
  int i;
  if( !pWInfo->bOrderedInnerLoop ) return;
  if( pWInfo->nOBSat==0 ) return;
  for(i=pWInfo->nLevel-1; i>=0; i--){
    pInner = &pWInfo->a[i];
    if( (pInner->pWLoop->wsFlags & WHERE_COLUMN_IN)!=0 ){
      sqlite3VdbeGoto(v, pInner->addrNxt);
      return;
    }
  }
  sqlite3VdbeGoto(v, pWInfo->iBreak);
}